

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodedstream.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_00;
  Ch *pCVar1;
  Ch *pCVar2;
  double dVar3;
  char cVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  ulong extraout_RAX;
  char *extraout_RAX_00;
  ulong extraout_RAX_01;
  char *extraout_RAX_02;
  MemoryStream *pMVar6;
  MemoryStream *extraout_RAX_03;
  MemoryStream *extraout_RAX_04;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *unaff_RBX;
  uint uVar14;
  SizeType SVar15;
  byte bVar16;
  uint16_t uVar17;
  int iVar18;
  undefined4 uVar19;
  ulong uVar20;
  char *pcVar21;
  long lVar22;
  ulong unaff_R12;
  int iVar23;
  ulong unaff_R13;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *unaff_R14;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  Number NStack_48;
  
  pcVar12 = is->is_->src_;
  if (pcVar12 == is->is_->end_) {
    cVar4 = '\0';
  }
  else {
    cVar4 = *pcVar12;
  }
  if (cVar4 == '\"') {
    ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler,false);
    return;
  }
  if (cVar4 == '[') {
    pMVar6 = is->is_;
    pbVar11 = (byte *)pMVar6->src_;
    if ((pbVar11 == (byte *)pMVar6->end_) || (*pbVar11 != 0x5b)) {
      ParseArray<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      pMVar6 = extraout_RAX_04;
      pbVar13 = extraout_RDX_00;
LAB_00138c98:
      bVar25 = false;
LAB_00138b42:
      if ((pbVar13 != pbVar11) && (bVar25)) {
        pMVar6->src_ = (Ch *)(pbVar13 + 1);
      }
      if (bVar25) {
        bVar25 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,0);
        if (!bVar25) {
          if (*(int *)(unaff_RBX + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                          ,0x334,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
LAB_00138ca5:
          pMVar6 = unaff_R14->is_;
          uVar19 = 0x10;
LAB_00138cad:
          pCVar1 = pMVar6->src_;
          pCVar2 = pMVar6->begin_;
          *(undefined4 *)(unaff_RBX + 0x30) = uVar19;
          *(long *)(unaff_RBX + 0x38) = (long)pCVar1 - (long)pCVar2;
        }
      }
      else {
        ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (unaff_RBX,unaff_R14,handler);
        if (*(int *)(unaff_RBX + 0x30) == 0) {
          SVar15 = 0;
LAB_00138b88:
          pMVar6 = unaff_R14->is_;
          pbVar11 = (byte *)pMVar6->src_;
          pbVar13 = (byte *)pMVar6->end_;
          do {
            if (pbVar11 == pbVar13) {
              uVar24 = 0;
            }
            else {
              uVar24 = (ulong)*pbVar11;
            }
            do {
              if ((0x20 < (byte)uVar24) || ((unaff_R12 >> (uVar24 & 0x3f) & 1) == 0)) {
                pbVar11 = (byte *)pMVar6->src_;
                if (pbVar11 == pbVar13) {
                  bVar25 = false;
                }
                else {
                  bVar25 = *pbVar11 == 0x2c;
                  if (bVar25) {
                    pMVar6->src_ = (Ch *)(pbVar11 + 1);
                  }
                }
                SVar15 = SVar15 + 1;
                pbVar11 = (byte *)pMVar6->src_;
                if (bVar25) goto LAB_00138be6;
                if (pbVar11 == pbVar13) {
                  bVar25 = false;
                }
                else {
                  bVar25 = *pbVar11 == 0x5d;
                  if (bVar25) {
                    pMVar6->src_ = (Ch *)(pbVar11 + 1);
                  }
                }
                uVar19 = 7;
                if (!bVar25) goto LAB_00138cad;
                bVar25 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                         ::EndArray(handler,SVar15);
                if (bVar25) {
                  return;
                }
                if (*(int *)(unaff_RBX + 0x30) != 0) {
                  __assert_fail("!HasParseError()",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                                ,0x346,
                                "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                               );
                }
                goto LAB_00138ca5;
              }
              uVar24 = 0;
            } while (pbVar11 == pbVar13);
            pbVar11 = pbVar11 + 1;
            pMVar6->src_ = (Ch *)pbVar11;
          } while( true );
        }
      }
      return;
    }
    if (pbVar11 != (byte *)pMVar6->end_) {
      pMVar6->src_ = (Ch *)(pbVar11 + 1);
    }
    pGVar5 = internal::Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                       (&handler->stack_,1);
    (pGVar5->data_).n = (Number)0x0;
    (pGVar5->data_).s.str = (Ch *)0x0;
    (pGVar5->data_).f.flags = 4;
    pMVar6 = is->is_;
    pbVar13 = (byte *)pMVar6->src_;
    pbVar11 = (byte *)pMVar6->end_;
    unaff_R12 = 0x100002600;
    do {
      if (pbVar13 == pbVar11) {
        uVar24 = 0;
      }
      else {
        uVar24 = (ulong)*pbVar13;
      }
      do {
        if ((0x20 < (byte)uVar24) || ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0)) {
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar13 = (byte *)pMVar6->src_;
          unaff_RBX = this;
          unaff_R14 = is;
          if (pbVar13 == pbVar11) goto LAB_00138c98;
          bVar25 = *pbVar13 == 0x5d;
          goto LAB_00138b42;
        }
        uVar24 = 0;
      } while (pbVar13 == pbVar11);
      pbVar13 = pbVar13 + 1;
      pMVar6->src_ = (Ch *)pbVar13;
    } while( true );
  }
  if (cVar4 == 'f') {
    pMVar6 = is->is_;
    pcVar12 = pMVar6->src_;
    pcVar21 = pMVar6->end_;
    if ((pcVar12 == pcVar21) || (*pcVar12 != 'f')) {
      ParseFalse<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      pcVar12 = extraout_RAX_02;
    }
    else {
      if (pcVar12 != pcVar21) {
        pMVar6->src_ = pcVar12 + 1;
      }
      pcVar12 = pMVar6->src_;
      unaff_RBX = this;
      if (pcVar12 != pcVar21) {
        bVar25 = *pcVar12 == 'a';
        goto LAB_00138658;
      }
    }
    bVar25 = false;
LAB_00138658:
    if ((pcVar12 != pcVar21) && (bVar25)) {
      pMVar6->src_ = pcVar12 + 1;
    }
    if ((!bVar25) ||
       (ParseFalse<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (), (extraout_RAX_01 & 1) != 0)) {
      if (*(int *)(unaff_RBX + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x37b,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pCVar1 = pMVar6->src_;
      pCVar2 = pMVar6->begin_;
      *(undefined4 *)(unaff_RBX + 0x30) = 3;
      *(long *)(unaff_RBX + 0x38) = (long)pCVar1 - (long)pCVar2;
    }
    return;
  }
  if (cVar4 == '{') {
    pMVar6 = is->is_;
    pbVar11 = (byte *)pMVar6->src_;
    if ((pbVar11 == (byte *)pMVar6->end_) || (*pbVar11 != 0x7b)) {
      ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      pMVar6 = extraout_RAX_03;
      pbVar13 = extraout_RDX;
LAB_00138a91:
      bVar25 = false;
LAB_00138841:
      if ((pbVar13 != pbVar11) && (bVar25)) {
        pMVar6->src_ = (Ch *)(pbVar13 + 1);
      }
      this_00 = unaff_RBX + 0x30;
      if (bVar25) {
        bVar25 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,0);
        if (bVar25) {
          return;
        }
        ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this_00);
LAB_00138a35:
        pMVar6 = unaff_R14->is_;
        pbVar11 = (byte *)pMVar6->src_;
        uVar19 = 0x10;
      }
      else {
        pMVar6 = unaff_R14->is_;
        pbVar11 = (byte *)pMVar6->src_;
        if ((pbVar11 != (byte *)pMVar6->end_) && (*pbVar11 == 0x22)) {
          SVar15 = 0;
LAB_00138894:
          ParseString<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (unaff_RBX,unaff_R14,handler,true);
          if (*(int *)(unaff_RBX + 0x30) != 0) {
            return;
          }
          pMVar6 = unaff_R14->is_;
          pbVar11 = (byte *)pMVar6->src_;
          pbVar13 = (byte *)pMVar6->end_;
          do {
            if (pbVar11 == pbVar13) {
              uVar24 = 0;
            }
            else {
              uVar24 = (ulong)*pbVar11;
            }
            do {
              if ((0x20 < (byte)uVar24) || ((unaff_R13 >> (uVar24 & 0x3f) & 1) == 0)) {
                pbVar11 = (byte *)pMVar6->src_;
                if (pbVar11 == pbVar13) {
                  bVar25 = false;
                }
                else {
                  bVar25 = *pbVar11 == 0x3a;
                  if (bVar25) {
                    pMVar6->src_ = (Ch *)(pbVar11 + 1);
                  }
                }
                pbVar11 = (byte *)pMVar6->src_;
                if (bVar25) goto LAB_00138915;
                uVar19 = 5;
                goto LAB_00138a72;
              }
              uVar24 = 0;
            } while (pbVar11 == pbVar13);
            pbVar11 = pbVar11 + 1;
            pMVar6->src_ = (Ch *)pbVar11;
          } while( true );
        }
LAB_00138a42:
        uVar19 = 4;
        if (*(int *)this_00 != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                        ,0x2f6,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
LAB_00138a72:
      pCVar1 = pMVar6->begin_;
      *(undefined4 *)(unaff_RBX + 0x30) = uVar19;
      *(long *)(unaff_RBX + 0x38) = (long)pbVar11 - (long)pCVar1;
      return;
    }
    if (pbVar11 != (byte *)pMVar6->end_) {
      pMVar6->src_ = (Ch *)(pbVar11 + 1);
    }
    pGVar5 = internal::Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                       (&handler->stack_,1);
    (pGVar5->data_).n = (Number)0x0;
    (pGVar5->data_).s.str = (Ch *)0x0;
    (pGVar5->data_).f.flags = 3;
    pMVar6 = is->is_;
    pbVar13 = (byte *)pMVar6->src_;
    pbVar11 = (byte *)pMVar6->end_;
    unaff_R13 = 0x100002600;
    do {
      if (pbVar13 == pbVar11) {
        uVar24 = 0;
      }
      else {
        uVar24 = (ulong)*pbVar13;
      }
      do {
        if ((0x20 < (byte)uVar24) || ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0)) {
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar13 = (byte *)pMVar6->src_;
          unaff_RBX = this;
          unaff_R14 = is;
          if (pbVar13 == pbVar11) goto LAB_00138a91;
          bVar25 = *pbVar13 == 0x7d;
          goto LAB_00138841;
        }
        uVar24 = 0;
      } while (pbVar13 == pbVar11);
      pbVar13 = pbVar13 + 1;
      pMVar6->src_ = (Ch *)pbVar13;
    } while( true );
  }
  if (cVar4 == 't') {
    pMVar6 = is->is_;
    pcVar12 = pMVar6->src_;
    pcVar21 = pMVar6->end_;
    if ((pcVar12 == pcVar21) || (*pcVar12 != 't')) {
      ParseTrue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
      pcVar12 = extraout_RAX_00;
    }
    else {
      if (pcVar12 != pcVar21) {
        pMVar6->src_ = pcVar12 + 1;
      }
      pcVar12 = pMVar6->src_;
      unaff_RBX = this;
      if (pcVar12 != pcVar21) {
        bVar25 = *pcVar12 == 'r';
        goto LAB_001385bc;
      }
    }
    bVar25 = false;
LAB_001385bc:
    if ((pcVar12 != pcVar21) && (bVar25)) {
      pMVar6->src_ = pcVar12 + 1;
    }
    if ((!bVar25) ||
       (ParseTrue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (), (extraout_RAX & 1) != 0)) {
      if (*(int *)(unaff_RBX + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x36e,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pCVar1 = pMVar6->src_;
      pCVar2 = pMVar6->begin_;
      *(undefined4 *)(unaff_RBX + 0x30) = 3;
      *(long *)(unaff_RBX + 0x38) = (long)pCVar1 - (long)pCVar2;
    }
    return;
  }
  if (cVar4 == 'n') {
    ParseNull<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pMVar6 = is->is_;
  pcVar12 = pMVar6->src_;
  pCVar1 = pMVar6->begin_;
  pcVar21 = pMVar6->end_;
  if (pcVar12 == pcVar21) {
    bVar25 = false;
  }
  else {
    bVar25 = *pcVar12 == '-';
    if (bVar25) {
      pMVar6->src_ = pcVar12 + 1;
    }
  }
  pcVar10 = pMVar6->src_;
  if (pcVar10 == pcVar21) {
LAB_0010df1e:
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                    ,0x602,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar22 = (long)pcVar10 - (long)pCVar1;
    *(undefined4 *)(this + 0x30) = 3;
    goto LAB_0010df6d;
  }
  if (*pcVar10 == '0') {
    if (pcVar10 != pcVar21) {
      pMVar6->src_ = pcVar10 + 1;
    }
    iVar23 = 0;
    bVar26 = false;
    uVar24 = 0;
    uVar14 = 0;
  }
  else {
    if ((pcVar10 == pcVar21) || (*pcVar10 < '1')) goto LAB_0010df1e;
    uVar14 = 0xffffffd0;
    if (pcVar10 != pcVar21) {
      if ('9' < *pcVar10) goto LAB_0010df1e;
      if (pcVar10 != pcVar21) {
        pMVar6->src_ = pcVar10 + 1;
        uVar14 = (int)*pcVar10 - 0x30;
      }
    }
    pcVar10 = pMVar6->src_;
    bVar26 = pcVar10 == pcVar21;
    if (bVar25) {
      if (pcVar10 == pcVar21) {
LAB_0010d735:
        iVar23 = 0;
      }
      else {
        iVar23 = 0;
        do {
          if (*pcVar10 < '0') {
LAB_0010d72a:
            uVar24 = 0;
            bVar26 = false;
            goto LAB_0010d73d;
          }
          if ((!bVar26) && ('9' < *pcVar10)) break;
          if ((0xccccccb < uVar14) && ((uVar14 != 0xccccccc || ((!bVar26 && ('8' < *pcVar10)))))) {
LAB_0010d72e:
            uVar24 = (ulong)uVar14;
            bVar26 = true;
            goto LAB_0010d73d;
          }
          if (bVar26) {
            iVar7 = -0x30;
          }
          else {
            pMVar6->src_ = pcVar10 + 1;
            iVar7 = *pcVar10 + -0x30;
            pcVar10 = pcVar10 + 1;
          }
          uVar14 = uVar14 * 10 + iVar7;
          iVar23 = iVar23 + 1;
          bVar26 = pcVar10 == pcVar21;
        } while (!bVar26);
      }
    }
    else {
      if (pcVar10 == pcVar21) goto LAB_0010d735;
      iVar23 = 0;
      do {
        if (*pcVar10 < '0') goto LAB_0010d72a;
        if ((!bVar26) && ('9' < *pcVar10)) break;
        if ((0x19999998 < uVar14) && ((uVar14 != 0x19999999 || ((!bVar26 && ('5' < *pcVar10))))))
        goto LAB_0010d72e;
        if (bVar26) {
          iVar7 = -0x30;
        }
        else {
          pMVar6->src_ = pcVar10 + 1;
          iVar7 = *pcVar10 + -0x30;
          pcVar10 = pcVar10 + 1;
        }
        uVar14 = uVar14 * 10 + iVar7;
        iVar23 = iVar23 + 1;
        bVar26 = pcVar10 == pcVar21;
      } while (!bVar26);
    }
    bVar26 = false;
    uVar24 = 0;
  }
LAB_0010d73d:
  dVar3 = 0.0;
  if (bVar26) {
    pcVar10 = pMVar6->src_;
    bVar27 = pcVar10 == pcVar21;
    if (bVar25) {
      if (pcVar10 == pcVar21) goto LAB_0010d869;
      while (('/' < *pcVar10 && ((bVar27 || (*pcVar10 < ':'))))) {
        if ((0xccccccccccccccb < uVar24) &&
           ((uVar24 != 0xccccccccccccccc || ((!bVar27 && ('8' < *pcVar10)))))) {
LAB_0010d873:
          auVar30._8_4_ = (int)(uVar24 >> 0x20);
          auVar30._0_8_ = uVar24;
          auVar30._12_4_ = 0x45300000;
          dVar3 = (auVar30._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar24) - 4503599627370496.0);
          bVar27 = true;
          goto LAB_0010d899;
        }
        if (bVar27) {
          uVar8 = 0xffffffd0;
        }
        else {
          pMVar6->src_ = pcVar10 + 1;
          uVar8 = (ulong)((int)*pcVar10 - 0x30);
          pcVar10 = pcVar10 + 1;
        }
        uVar24 = uVar24 * 10 + uVar8;
        iVar23 = iVar23 + 1;
        bVar27 = pcVar10 == pcVar21;
        if (bVar27) break;
      }
    }
    else {
      if (pcVar10 == pcVar21) goto LAB_0010d869;
      while (('/' < *pcVar10 && ((bVar27 || (*pcVar10 < ':'))))) {
        if ((0x1999999999999998 < uVar24) &&
           ((uVar24 != 0x1999999999999999 || ((!bVar27 && ('5' < *pcVar10)))))) goto LAB_0010d873;
        if (bVar27) {
          uVar8 = 0xffffffd0;
        }
        else {
          pMVar6->src_ = pcVar10 + 1;
          uVar8 = (ulong)((int)*pcVar10 - 0x30);
          pcVar10 = pcVar10 + 1;
        }
        uVar24 = uVar24 * 10 + uVar8;
        iVar23 = iVar23 + 1;
        bVar27 = pcVar10 == pcVar21;
        if (bVar27) break;
      }
    }
    bVar27 = false;
  }
  else {
LAB_0010d869:
    bVar27 = false;
  }
LAB_0010d899:
  if (bVar27) {
    pcVar10 = pMVar6->src_;
    bVar28 = pcVar10 == pcVar21;
    if (!bVar28) {
      while ('/' < *pcVar10) {
        if (bVar28) {
          dVar33 = -48.0;
        }
        else {
          if ('9' < *pcVar10) break;
          pMVar6->src_ = pcVar10 + 1;
          dVar33 = (double)(*pcVar10 + -0x30);
          pcVar10 = pcVar10 + 1;
        }
        dVar3 = dVar3 * 10.0 + dVar33;
        bVar28 = pcVar10 == pcVar21;
        if (bVar28) break;
      }
    }
  }
  pcVar10 = pMVar6->src_;
  if (pcVar10 == pcVar21) {
    bVar28 = false;
  }
  else {
    bVar28 = *pcVar10 == '.';
    if (bVar28) {
      pMVar6->src_ = pcVar10 + 1;
    }
  }
  iVar7 = 0;
  uVar8 = (ulong)uVar14;
  if (bVar28) {
    pcVar10 = pMVar6->src_;
    if (((pcVar10 == pcVar21) || (*pcVar10 < '0')) || ((pcVar10 != pcVar21 && ('9' < *pcVar10)))) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x62d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar22 = (long)pcVar10 - (long)pCVar1;
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_0010df6d;
    }
    iVar7 = 0;
    if (!bVar27) {
      if (!bVar26) {
        uVar24 = uVar8;
      }
      iVar7 = 0;
      pcVar10 = pMVar6->src_;
      while( true ) {
        if (pcVar10 == pcVar21) {
          bVar27 = true;
        }
        else {
          bVar27 = *pcVar10 < '0';
          if ((pcVar10 != pcVar21) && ('/' < *pcVar10)) {
            bVar27 = '9' < *pcVar10;
          }
        }
        if ((bVar27) || (uVar24 >> 0x35 != 0)) break;
        uVar20 = 0xffffffd0;
        pcVar9 = pcVar10;
        if (pcVar10 != pcVar21) {
          pcVar9 = pcVar10 + 1;
          pMVar6->src_ = pcVar9;
          uVar20 = (ulong)((int)*pcVar10 - 0x30);
        }
        iVar7 = iVar7 + -1;
        uVar24 = uVar24 * 10 + uVar20;
        iVar23 = iVar23 + (uint)(uVar24 != 0);
        pcVar10 = pcVar9;
      }
      auVar31._8_4_ = (int)(uVar24 >> 0x20);
      auVar31._0_8_ = uVar24;
      auVar31._12_4_ = 0x45300000;
      dVar3 = (auVar31._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar24) - 4503599627370496.0);
      bVar27 = true;
    }
    pcVar10 = pMVar6->src_;
    while (((bVar28 = pcVar10 == pcVar21, !bVar28 && ('/' < *pcVar10)) &&
           ((bVar28 || (*pcVar10 < ':'))))) {
      if (iVar23 < 0x11) {
        if (bVar28) {
          dVar33 = -48.0;
        }
        else {
          pMVar6->src_ = pcVar10 + 1;
          dVar33 = (double)(*pcVar10 + -0x30);
          pcVar10 = pcVar10 + 1;
        }
        dVar3 = dVar3 * 10.0 + dVar33;
        iVar7 = iVar7 + -1;
        if (0.0 < dVar3) {
          iVar23 = iVar23 + 1;
        }
      }
      else if (!bVar28) {
        pcVar10 = pcVar10 + 1;
        pMVar6->src_ = pcVar10;
      }
    }
  }
  pcVar10 = pMVar6->src_;
  if (pcVar10 == pcVar21) {
    bVar28 = false;
  }
  else {
    bVar28 = *pcVar10 == 'e';
    if (bVar28) {
      pMVar6->src_ = pcVar10 + 1;
    }
  }
  lVar22 = (long)pcVar12 - (long)pCVar1;
  if (bVar28) {
LAB_0010dad7:
    uVar20 = uVar8;
    if (bVar26) {
      uVar20 = uVar24;
    }
    if (!bVar27) {
      auVar32._8_4_ = (int)(uVar20 >> 0x20);
      auVar32._0_8_ = uVar20;
      auVar32._12_4_ = 0x45300000;
      dVar3 = (auVar32._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
      bVar27 = true;
    }
    pcVar12 = pMVar6->src_;
    if (pcVar12 == pcVar21) {
      bVar28 = false;
    }
    else {
      bVar28 = *pcVar12 == '+';
      if (bVar28) {
        pMVar6->src_ = pcVar12 + 1;
      }
    }
    if (bVar28) {
      bVar28 = false;
    }
    else {
      pcVar12 = pMVar6->src_;
      if (pcVar12 == pcVar21) {
        bVar28 = false;
      }
      else {
        bVar28 = *pcVar12 == '-';
        if (bVar28) {
          pMVar6->src_ = pcVar12 + 1;
        }
      }
    }
    pcVar12 = pMVar6->src_;
    if ((pcVar12 == pcVar21) || (*pcVar12 < '0')) {
LAB_0010df34:
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x682,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xf;
      *(long *)(this + 0x38) = (long)pcVar12 - (long)pCVar1;
      bVar28 = false;
      iVar23 = 0;
    }
    else {
      iVar23 = -0x30;
      if (pcVar12 != pcVar21) {
        if ('9' < *pcVar12) goto LAB_0010df34;
        if (pcVar12 != pcVar21) {
          pMVar6->src_ = pcVar12 + 1;
          iVar23 = *pcVar12 + -0x30;
        }
      }
      if (bVar28) {
        if (0 < iVar7) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                        ,0x66d,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        pcVar12 = pMVar6->src_;
joined_r0x0010dbc4:
        do {
          bVar29 = pcVar12 == pcVar21;
          if (((bVar29) || (*pcVar12 < '0')) || ((!bVar29 && ('9' < *pcVar12)))) goto LAB_0010dcc3;
          if (bVar29) {
            iVar18 = -0x30;
          }
          else {
            pMVar6->src_ = pcVar12 + 1;
            iVar18 = *pcVar12 + -0x30;
            pcVar12 = pcVar12 + 1;
          }
          iVar23 = iVar23 * 10 + iVar18;
          if ((iVar7 + 0x7ffffff7) / 10 < iVar23) {
            while( true ) {
              do {
                bVar29 = pcVar12 == pcVar21;
                if ((bVar29) || (*pcVar12 < '0')) goto joined_r0x0010dbc4;
              } while (bVar29);
              if ('9' < *pcVar12) break;
              if (!bVar29) {
                pcVar12 = pcVar12 + 1;
                pMVar6->src_ = pcVar12;
              }
            }
          }
        } while( true );
      }
      pcVar12 = pMVar6->src_;
      do {
        if (pcVar12 == pcVar21) {
          bVar29 = false;
        }
        else {
          bVar29 = '/' < *pcVar12;
          if ((pcVar12 != pcVar21) && ('/' < *pcVar12)) {
            bVar29 = *pcVar12 < ':';
          }
        }
        if (!bVar29) goto LAB_0010dcbb;
        if (pcVar12 == pcVar21) {
          iVar18 = -0x30;
        }
        else {
          pMVar6->src_ = pcVar12 + 1;
          iVar18 = *pcVar12 + -0x30;
          pcVar12 = pcVar12 + 1;
        }
        iVar23 = iVar23 * 10 + iVar18;
      } while (iVar23 <= 0x134 - iVar7);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x67d,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar22;
LAB_0010dcbb:
      if (bVar29) {
        bVar28 = false;
        goto LAB_0010dcd0;
      }
LAB_0010dcc3:
      if (bVar28) {
        iVar23 = -iVar23;
      }
      bVar28 = true;
    }
LAB_0010dcd0:
    if (!bVar28) {
      return;
    }
  }
  else {
    pcVar12 = pMVar6->src_;
    if (pcVar12 == pcVar21) {
      bVar28 = false;
    }
    else {
      bVar28 = *pcVar12 == 'E';
      if (bVar28) {
        pMVar6->src_ = pcVar12 + 1;
      }
    }
    iVar23 = 0;
    if (bVar28) goto LAB_0010dad7;
  }
  if (bVar27) {
    uVar14 = iVar23 + iVar7;
    if ((int)uVar14 < -0x134) {
      NStack_48.i64 = 0;
      if (-0x269 < (int)uVar14) {
        uVar14 = -uVar14 - 0x134;
        if (0x134 < uVar14) goto LAB_0010dfea;
        dVar3 = dVar3 / 1e+308;
LAB_0010de6d:
        NStack_48.d = dVar3 / *(double *)(internal::Pow10(int)::e + (ulong)uVar14 * 8);
      }
    }
    else {
      if ((int)uVar14 < 0) {
        uVar14 = -uVar14;
        if (0x134 < uVar14) goto LAB_0010dfea;
        goto LAB_0010de6d;
      }
      if (0x134 < uVar14) {
LAB_0010dfea:
        __assert_fail("n >= 0 && n <= 308",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/pow10.h"
                      ,0x30,"double rapidjson::internal::Pow10(int)");
      }
      NStack_48.d = dVar3 * *(double *)(internal::Pow10(int)::e + (ulong)uVar14 * 8);
    }
    if (NStack_48.d <= 1.79769313486232e+308) {
      if (bVar25) {
        NStack_48.u64 = NStack_48.u64 ^ 0x8000000000000000;
      }
      pGVar5 = internal::Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         (&handler->stack_,1);
      (pGVar5->data_).n = (Number)0x0;
      (pGVar5->data_).s.str = (Ch *)0x0;
      (pGVar5->data_).n = NStack_48;
      (pGVar5->data_).f.flags = 0x216;
LAB_0010def9:
      bVar25 = true;
      bVar26 = false;
    }
    else {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                      ,0x6b1,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar22;
      bVar26 = true;
      bVar25 = true;
    }
  }
  else {
    if (!bVar26) {
      if (bVar25) {
        pGVar5 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        uVar17 = 0xb6;
        if ((int)uVar14 < 1) {
          uVar17 = 0x1f6;
        }
        (pGVar5->data_).n = (Number)0x0;
        (pGVar5->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar5->data_ = (long)(int)-uVar14;
        (pGVar5->data_).f.flags = uVar17;
      }
      else {
        pGVar5 = internal::Stack<rapidjson::CrtAllocator>::
                 Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           (&handler->stack_,1);
        (pGVar5->data_).n = (Number)0x0;
        (pGVar5->data_).s.str = (Ch *)0x0;
        *(ulong *)&pGVar5->data_ = uVar8;
        (pGVar5->data_).f.flags = (ushort)(-1 < (int)uVar14) << 5 | 0x1d6;
      }
      goto LAB_0010def9;
    }
    if (bVar25) {
      bVar25 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Int64(handler,-uVar24);
    }
    else {
      pGVar5 = internal::Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         (&handler->stack_,1);
      (pGVar5->data_).n = (Number)0x0;
      (pGVar5->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar5->data_ = uVar24;
      (pGVar5->data_).f.flags =
           (ushort)(uVar24 < 0x80000000) * 0x20 +
           ((ushort)(uVar24 >> 0x20 == 0) << 6 | (ushort)(-1 < (long)uVar24) << 7) + 0x116;
      bVar25 = true;
    }
    bVar26 = false;
  }
  if (bVar26) {
    return;
  }
  if (bVar25 != false) {
    return;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                  ,0x6c9,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_0010df6d:
  *(long *)(this + 0x38) = lVar22;
  return;
LAB_00138be6:
  if (pbVar11 == pbVar13) {
    uVar24 = 0;
  }
  else {
    uVar24 = (ulong)*pbVar11;
  }
  do {
    if ((0x20 < (byte)uVar24) || ((unaff_R12 >> (uVar24 & 0x3f) & 1) == 0)) {
      ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (unaff_RBX,unaff_R14,handler);
      if (*(int *)(unaff_RBX + 0x30) != 0) {
        return;
      }
      goto LAB_00138b88;
    }
    uVar24 = 0;
  } while (pbVar11 == pbVar13);
  pbVar11 = pbVar11 + 1;
  pMVar6->src_ = (Ch *)pbVar11;
  goto LAB_00138be6;
LAB_00138915:
  if (pbVar11 == pbVar13) {
    uVar24 = 0;
  }
  else {
    uVar24 = (ulong)*pbVar11;
  }
  do {
    if ((0x20 < (byte)uVar24) || ((unaff_R13 >> (uVar24 & 0x3f) & 1) == 0)) {
      if (*(int *)this_00 != 0) {
        return;
      }
      ParseValue<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (unaff_RBX,unaff_R14,handler);
      if (*(int *)(unaff_RBX + 0x30) != 0) {
        return;
      }
      pMVar6 = unaff_R14->is_;
      pbVar11 = (byte *)pMVar6->src_;
      pbVar13 = (byte *)pMVar6->end_;
      goto LAB_0013896d;
    }
    uVar24 = 0;
  } while (pbVar11 == pbVar13);
  pbVar11 = pbVar11 + 1;
  pMVar6->src_ = (Ch *)pbVar11;
  goto LAB_00138915;
LAB_0013896d:
  if (pbVar11 == pbVar13) {
    uVar24 = 0;
  }
  else {
    uVar24 = (ulong)*pbVar11;
  }
  do {
    if ((0x20 < (byte)uVar24) || ((unaff_R13 >> (uVar24 & 0x3f) & 1) == 0)) {
      pbVar11 = (byte *)pMVar6->src_;
      if (pbVar11 == pbVar13) {
        bVar16 = 0;
      }
      else {
        bVar16 = *pbVar11;
      }
      SVar15 = SVar15 + 1;
      if (bVar16 == 0x2c) {
        if (pbVar11 != pbVar13) {
          pMVar6->src_ = (Ch *)(pbVar11 + 1);
        }
        pbVar11 = (byte *)pMVar6->src_;
        goto LAB_001389b9;
      }
      uVar19 = 6;
      if (bVar16 != 0x7d) goto LAB_00138a72;
      if (pbVar11 != pbVar13) {
        pMVar6->src_ = (Ch *)(pbVar11 + 1);
      }
      bVar25 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::EndObject(handler,SVar15);
      if (bVar25) {
        return;
      }
      ParseObject<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this_00);
      goto LAB_00138a35;
    }
    uVar24 = 0;
  } while (pbVar11 == pbVar13);
  pbVar11 = pbVar11 + 1;
  pMVar6->src_ = (Ch *)pbVar11;
  goto LAB_0013896d;
LAB_001389b9:
  if (pbVar11 == pbVar13) {
    uVar24 = 0;
  }
  else {
    uVar24 = (ulong)*pbVar11;
  }
  do {
    if ((0x20 < (byte)uVar24) || ((unaff_R13 >> (uVar24 & 0x3f) & 1) == 0)) {
      pMVar6 = unaff_R14->is_;
      pbVar11 = (byte *)pMVar6->src_;
      if ((pbVar11 == (byte *)pMVar6->end_) || (*pbVar11 != 0x22)) goto LAB_00138a42;
      goto LAB_00138894;
    }
    uVar24 = 0;
  } while (pbVar11 == pbVar13);
  pbVar11 = pbVar11 + 1;
  pMVar6->src_ = (Ch *)pbVar11;
  goto LAB_001389b9;
}

Assistant:

Ch Peek() const { return is_.Peek(); }